

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O1

void resampler_write_sample_fixed(void *_r,int s,uchar depth)

{
  int iVar1;
  int iVar2;
  float fVar3;
  uint uVar4;
  
  if (*(char *)((long)_r + 0x31) < '\0') {
    *(undefined1 *)((long)_r + 0x31) = 0;
    uVar4 = 0xf;
    if (*(char *)((long)_r + 0x30) != '\x05') {
      uVar4 = (uint)(*(char *)((long)_r + 0x30) == '\x04');
    }
    *(uint *)((long)_r + 4) = uVar4;
  }
  iVar1 = *(int *)((long)_r + 4);
  if (iVar1 < 0x40) {
    fVar3 = (float)s / (float)(1 << (depth - 1 & 0x1f));
    iVar2 = *_r;
    *(float *)((long)_r + (long)iVar2 * 4 + 0x48) = fVar3;
    *(float *)((long)_r + (long)iVar2 * 4 + 0x148) = fVar3;
    *(int *)((long)_r + 4) = iVar1 + 1;
    uVar4 = iVar2 + 0x40;
    if (-1 < (int)(iVar2 + 1U)) {
      uVar4 = iVar2 + 1U;
    }
    *(uint *)_r = (iVar2 - (uVar4 & 0xffffffc0)) + 1;
  }
  return;
}

Assistant:

void resampler_write_sample_fixed(void *_r, int s, unsigned char depth)
{
    resampler * r = ( resampler * ) _r;
    
    if ( r->delay_added < 0 )
    {
        r->delay_added = 0;
        r->write_filled = resampler_input_delay( r );
    }
    
    if ( r->write_filled < resampler_buffer_size )
    {
        double s32 = s;
        s32 /= (double)(1 << (depth - 1));
        
        r->buffer_in[ r->write_pos ] = (float)s32;
        r->buffer_in[ r->write_pos + resampler_buffer_size ] = (float)s32;
        
        ++r->write_filled;
        
        r->write_pos = ( r->write_pos + 1 ) % resampler_buffer_size;
    }
}